

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O0

void __thiscall tcu::x11::XlibWindow::getDimensions(XlibWindow *this,int *width,int *height)

{
  Display *pDVar1;
  undefined1 local_40 [4];
  undefined1 local_3c [4];
  uint depth;
  uint borderWidth;
  uint height_;
  uint width_;
  Window root;
  int y;
  int x;
  int *height_local;
  int *width_local;
  XlibWindow *this_local;
  
  _y = (uint *)height;
  height_local = width;
  width_local = (int *)this;
  pDVar1 = XlibDisplay::getXDisplay(this->m_display);
  XGetGeometry(pDVar1,this->m_window,&height_,(long)&root + 4,&root,&borderWidth,&depth,local_3c,
               local_40);
  if (height_local != (int *)0x0) {
    *height_local = borderWidth;
  }
  if (_y != (uint *)0x0) {
    *_y = depth;
  }
  return;
}

Assistant:

void XlibWindow::getDimensions (int* width, int* height) const
{
	int x, y;
	::Window root;
	unsigned width_, height_, borderWidth, depth;

	XGetGeometry(m_display.getXDisplay(), m_window, &root, &x, &y, &width_, &height_, &borderWidth, &depth);
	if (width != DE_NULL)
		*width = static_cast<int>(width_);
	if (height != DE_NULL)
		*height = static_cast<int>(height_);
}